

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O1

uint32_t __thiscall cfd::core::AbstractTransaction::GetTotalSize(AbstractTransaction *this)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  CfdException *this_00;
  int ret;
  size_t length;
  int local_4c;
  undefined8 local_48;
  undefined1 local_40 [32];
  
  local_48 = 0;
  pvVar1 = this->wally_tx_pointer_;
  iVar2 = (*this->_vptr_AbstractTransaction[7])();
  uVar3 = 0;
  if ((char)iVar2 != '\0') {
    uVar3 = (*this->_vptr_AbstractTransaction[9])(this,0);
    uVar3 = uVar3 & 1;
  }
  local_4c = wally_tx_get_length(pvVar1,uVar3,&local_48);
  if (local_4c == 0) {
    return (uint32_t)local_48;
  }
  local_40._0_8_ = "cfdcore_transaction_common.cpp";
  local_40._8_4_ = 0x23c;
  local_40._16_8_ = "GetTotalSize";
  logger::log<int&>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"wally_tx_get_length NG[{}].",
                    &local_4c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"transaction size calc error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t AbstractTransaction::GetTotalSize() const {
  size_t length = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  uint32_t flag = 0;
  if (HasWitness()) {
    flag = GetWallyFlag() & WALLY_TX_FLAG_USE_WITNESS;
  }
  int ret = wally_tx_get_length(tx_pointer, flag, &length);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_length NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "transaction size calc error.");
  }
  return static_cast<uint32_t>(length);
}